

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

TRANSPORT_LL_HANDLE
IoTHubTransportHttp_Create
          (IOTHUBTRANSPORT_CONFIG *config,TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  IOTHUB_CLIENT_CONFIG *pIVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  HTTPAPIEX_RESULT HVar5;
  LOGGER_LOG p_Var6;
  HTTPTRANSPORT_HANDLE_DATA *handleData;
  VECTOR_HANDLE pVVar7;
  long lVar8;
  TRANSPORT_CALLBACKS_INFO *pTVar9;
  char *pcVar10;
  byte bVar11;
  
  bVar11 = 0;
  if (config == (IOTHUBTRANSPORT_CONFIG *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar10 = "invalid arg (configuration is missing)";
      iVar4 = 0x3be;
LAB_0012a004:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",iVar4,1,pcVar10);
      return (TRANSPORT_LL_HANDLE)0x0;
    }
  }
  else {
    pIVar1 = config->upperConfig;
    if (pIVar1 == (IOTHUB_CLIENT_CONFIG *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "invalid arg (upperConfig is NULL)";
        iVar4 = 0x3c3;
        goto LAB_0012a004;
      }
    }
    else if (pIVar1->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "invalid arg (protocol is NULL)";
        iVar4 = 0x3c8;
        goto LAB_0012a004;
      }
    }
    else if (pIVar1->iotHubName == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "invalid arg (iotHubName is NULL)";
        iVar4 = 0x3cd;
        goto LAB_0012a004;
      }
    }
    else if (pIVar1->iotHubSuffix == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "invalid arg (iotHubSuffix is NULL)";
        iVar4 = 0x3d2;
        goto LAB_0012a004;
      }
    }
    else {
      iVar4 = IoTHub_Transport_ValidateCallbacks(cb_info);
      if (iVar4 == 0) {
        handleData = (HTTPTRANSPORT_HANDLE_DATA *)malloc(0x70);
        if (handleData == (HTTPTRANSPORT_HANDLE_DATA *)0x0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "unable to malloc";
            iVar4 = 0x3df;
            goto LAB_0012a004;
          }
        }
        else {
          HVar5 = HTTPAPIEX_Init();
          if (HVar5 == HTTPAPIEX_ERROR) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                        ,"IoTHubTransportHttp_Create",0x3e3,1,"Error initializing HTTP");
            }
          }
          else {
            _Var2 = create_hostName(handleData,config);
            if (_Var2) {
              _Var3 = create_httpApiExHandle(handleData,config);
            }
            else {
              _Var3 = false;
            }
            if (_Var3 != false) {
              pVVar7 = VECTOR_create(8);
              handleData->perDeviceList = pVVar7;
              if (pVVar7 != (VECTOR_HANDLE)0x0) {
                handleData->doBatchedTransfers = false;
                handleData->getMinimumPollingTime = 0x5dc;
                handleData->transport_ctx = ctx;
                pTVar9 = &handleData->transport_callbacks;
                for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
                  pTVar9->msg_input_cb = cb_info->msg_input_cb;
                  cb_info = (TRANSPORT_CALLBACKS_INFO *)((long)cb_info + (ulong)bVar11 * -0x10 + 8);
                  pTVar9 = (TRANSPORT_CALLBACKS_INFO *)((long)pTVar9 + (ulong)bVar11 * -0x10 + 8);
                }
                return handleData;
              }
              if (_Var3 != false) {
                HTTPAPIEX_Destroy(handleData->httpApiExHandle);
                handleData->httpApiExHandle = (HTTPAPIEX_HANDLE)0x0;
              }
            }
            if (_Var2) {
              STRING_delete(handleData->hostName);
              handleData->hostName = (STRING_HANDLE)0x0;
            }
            HTTPAPIEX_Deinit();
          }
          free(handleData);
        }
      }
      else {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          pcVar10 = "Invalid transport callback information";
          iVar4 = 0x3d7;
          goto LAB_0012a004;
        }
      }
    }
  }
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

static TRANSPORT_LL_HANDLE IoTHubTransportHttp_Create(const IOTHUBTRANSPORT_CONFIG* config, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    HTTPTRANSPORT_HANDLE_DATA* result;
    if (config == NULL)
    {
        LogError("invalid arg (configuration is missing)");
        result = NULL;
    }
    else if (config->upperConfig == NULL)
    {
        LogError("invalid arg (upperConfig is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->protocol == NULL)
    {
        LogError("invalid arg (protocol is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubName == NULL)
    {
        LogError("invalid arg (iotHubName is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("invalid arg (iotHubSuffix is NULL)");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("Invalid transport callback information");
        result = NULL;
    }
    else
    {
        result = (HTTPTRANSPORT_HANDLE_DATA*)malloc(sizeof(HTTPTRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
        }
        else if (HTTPAPIEX_Init() == HTTPAPIEX_ERROR)
        {
            LogError("Error initializing HTTP");
            free(result);
            result = NULL;
        }
        else
        {
            bool was_hostName_ok = create_hostName(result, config);
            bool was_httpApiExHandle_ok = was_hostName_ok && create_httpApiExHandle(result, config);
            bool was_perDeviceList_ok = was_httpApiExHandle_ok && create_perDeviceList(result);

            if (was_perDeviceList_ok)
            {
                result->doBatchedTransfers = false;
                result->getMinimumPollingTime = DEFAULT_GETMINIMUMPOLLINGTIME;

                result->transport_ctx = ctx;
                memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
            }
            else
            {
                if (was_httpApiExHandle_ok) destroy_httpApiExHandle(result);
                if (was_hostName_ok) destroy_hostName(result);
                HTTPAPIEX_Deinit();

                free(result);
                result = NULL;
            }
        }
    }
    return result;
}